

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCompare(Parse *pParse,Expr *pA,Expr *pB,int iTab)

{
  u32 *puVar1;
  u8 uVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  char *__s1;
  sqlite3_value *v;
  int iVar6;
  uint uVar7;
  sqlite3_value *pVal;
  long lVar8;
  u8 aff;
  uint uVar9;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  sqlite3_value *pR;
  sqlite3_value *local_38;
  
  if (pA == (Expr *)0x0 || pB == (Expr *)0x0) {
    return (uint)(pB != pA) * 2;
  }
  if ((pParse != (Parse *)0x0) && (pA->op == 0x9c)) {
    local_38 = (Mem *)0x0;
    valueFromExpr(pParse->db,pB,'\x01','A',&local_38,
                  (ValueNewStat4Ctx *)CONCAT71(in_register_00000089,in_R9B));
    v = local_38;
    if (local_38 != (Mem *)0x0) {
      sVar5 = pA->iColumn;
      uVar9 = 0x80000000;
      if (sVar5 < 0x20) {
        uVar9 = 1 << ((char)sVar5 - 1U & 0x1f);
      }
      puVar1 = &pParse->pVdbe->expmask;
      *puVar1 = *puVar1 | uVar9;
      pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar5,aff);
      if (pVal == (sqlite3_value *)0x0) {
        sqlite3ValueFree(v);
        sqlite3ValueFree((sqlite3_value *)0x0);
      }
      else {
        uVar9._0_2_ = pVal->flags;
        uVar9._2_1_ = pVal->enc;
        uVar9._3_1_ = pVal->eSubtype;
        if ((0x4000000040004U >> ((ulong)uVar9 & 0x3f) & 1) != 0) {
          sqlite3ValueText(pVal,'\x01');
        }
        iVar6 = sqlite3MemCompare(pVal,v,(CollSeq *)0x0);
        sqlite3ValueFree(v);
        sqlite3ValueFree(pVal);
        if (iVar6 == 0) {
          return 0;
        }
      }
    }
  }
  uVar9 = pB->flags | pA->flags;
  if ((uVar9 >> 0xb & 1) != 0) {
    if ((((pA->flags & pB->flags) >> 0xb & 1) != 0) && ((pA->u).iValue == (pB->u).iValue)) {
      return 0;
    }
    return 2;
  }
  uVar2 = pA->op;
  if ((uVar2 == 'G') || (uVar2 != pB->op)) {
    if ((uVar2 == 'q') && (uVar7 = sqlite3ExprCompare(pParse,pA->pLeft,pB,iTab), uVar7 < 2)) {
      return 1;
    }
    if ((pB->op == 'q') && (uVar7 = sqlite3ExprCompare(pParse,pA,pB->pLeft,iTab), uVar7 < 2)) {
      return 1;
    }
    if (pA->op != 0xa9) {
      return 2;
    }
    if (pB->op != 0xa7) {
      return 2;
    }
    if (-1 < pB->iTable) {
      return 2;
    }
    if (pA->iTable != iTab) {
      return 2;
    }
  }
  __s1 = (pA->u).zToken;
  if (__s1 == (char *)0x0) goto LAB_001752f5;
  bVar3 = pA->op;
  if (bVar3 < 0xa8) {
    if (bVar3 == 0x71) {
      if ((pB->u).zToken == (char *)0x0) {
        return 2;
      }
      lVar8 = 0;
      do {
        bVar3 = __s1[lVar8];
        bVar4 = (pB->u).zToken[lVar8];
        if (bVar3 == bVar4) {
          if ((ulong)bVar3 == 0) goto LAB_001752f5;
        }
        else if (""[bVar3] != ""[bVar4]) {
          return 2;
        }
        lVar8 = lVar8 + 1;
      } while( true );
    }
    if (bVar3 == 0x79) {
      return 0;
    }
  }
  else if ((bVar3 == 0xac) || (bVar3 == 0xa8)) {
    lVar8 = 0;
    do {
      bVar3 = __s1[lVar8];
      bVar4 = (pB->u).zToken[lVar8];
      if (bVar3 == bVar4) {
        if ((ulong)bVar3 == 0) goto LAB_00175291;
      }
      else if (""[bVar3] != ""[bVar4]) goto LAB_00175291;
      lVar8 = lVar8 + 1;
    } while( true );
  }
  if ((((pB->u).zToken == (char *)0x0) || (bVar3 == 0xa7)) || (bVar3 == 0xa9)) goto LAB_001752f5;
  iVar6 = strcmp(__s1,(pB->u).zToken);
LAB_001752f1:
  if (iVar6 != 0) {
    return 2;
  }
LAB_001752f5:
  if (((pB->flags ^ pA->flags) & 0x404) != 0) {
    return 2;
  }
  if ((uVar9 >> 0x10 & 1) == 0) {
    if ((uVar9 >> 0xc & 1) != 0) {
      return 2;
    }
    if (((uVar9 & 0x20) == 0) &&
       (iVar6 = sqlite3ExprCompare(pParse,pA->pLeft,pB->pLeft,iTab), iVar6 != 0)) {
      return 2;
    }
    iVar6 = sqlite3ExprCompare(pParse,pA->pRight,pB->pRight,iTab);
    if (iVar6 != 0) {
      return 2;
    }
    iVar6 = sqlite3ExprListCompare((pA->x).pList,(pB->x).pList,iTab);
    if (iVar6 != 0) {
      return 2;
    }
    uVar2 = pA->op;
    if (((uVar2 != 'u') && (uVar2 != 0xaa)) && ((uVar9 >> 0xe & 1) == 0)) {
      if (pA->iColumn != pB->iColumn) {
        return 2;
      }
      if ((uVar2 == 0xaf) && (pA->op2 != pB->op2)) {
        return 2;
      }
      if (((uVar2 != '1') && (pA->iTable != iTab)) && (pA->iTable != pB->iTable)) {
        return 2;
      }
    }
  }
  return 0;
LAB_00175291:
  if (bVar3 != bVar4) {
    return 2;
  }
  uVar7 = pA->flags & 0x1000000;
  if (uVar7 >> 0x18 != (uint)((pB->flags >> 0x18 & 1) != 0)) {
    return 2;
  }
  if (uVar7 == 0) goto LAB_001752f5;
  iVar6 = sqlite3WindowCompare(pParse,(pA->y).pWin,(pB->y).pWin,1);
  goto LAB_001752f1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompare(
  const Parse *pParse,
  const Expr *pA,
  const Expr *pB,
  int iTab
){
  u32 combinedFlags;
  if( pA==0 || pB==0 ){
    return pB==pA ? 0 : 2;
  }
  if( pParse && pA->op==TK_VARIABLE && exprCompareVariable(pParse, pA, pB) ){
    return 0;
  }
  combinedFlags = pA->flags | pB->flags;
  if( combinedFlags & EP_IntValue ){
    if( (pA->flags&pB->flags&EP_IntValue)!=0 && pA->u.iValue==pB->u.iValue ){
      return 0;
    }
    return 2;
  }
  if( pA->op!=pB->op || pA->op==TK_RAISE ){
    if( pA->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA->pLeft,pB,iTab)<2 ){
      return 1;
    }
    if( pB->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA,pB->pLeft,iTab)<2 ){
      return 1;
    }
    if( pA->op==TK_AGG_COLUMN && pB->op==TK_COLUMN
     && pB->iTable<0 && pA->iTable==iTab
    ){
      /* fall through */
    }else{
      return 2;
    }
  }
  assert( !ExprHasProperty(pA, EP_IntValue) );
  assert( !ExprHasProperty(pB, EP_IntValue) );
  if( pA->u.zToken ){
    if( pA->op==TK_FUNCTION || pA->op==TK_AGG_FUNCTION ){
      if( sqlite3StrICmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
#ifndef SQLITE_OMIT_WINDOWFUNC
      assert( pA->op==pB->op );
      if( ExprHasProperty(pA,EP_WinFunc)!=ExprHasProperty(pB,EP_WinFunc) ){
        return 2;
      }
      if( ExprHasProperty(pA,EP_WinFunc) ){
        if( sqlite3WindowCompare(pParse, pA->y.pWin, pB->y.pWin, 1)!=0 ){
          return 2;
        }
      }
#endif
    }else if( pA->op==TK_NULL ){
      return 0;
    }else if( pA->op==TK_COLLATE ){
      if( sqlite3_stricmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
    }else
    if( pB->u.zToken!=0
     && pA->op!=TK_COLUMN
     && pA->op!=TK_AGG_COLUMN
     && strcmp(pA->u.zToken,pB->u.zToken)!=0
    ){
      return 2;
    }
  }
  if( (pA->flags & (EP_Distinct|EP_Commuted))
     != (pB->flags & (EP_Distinct|EP_Commuted)) ) return 2;
  if( ALWAYS((combinedFlags & EP_TokenOnly)==0) ){
    if( combinedFlags & EP_xIsSelect ) return 2;
    if( (combinedFlags & EP_FixedCol)==0
     && sqlite3ExprCompare(pParse, pA->pLeft, pB->pLeft, iTab) ) return 2;
    if( sqlite3ExprCompare(pParse, pA->pRight, pB->pRight, iTab) ) return 2;
    if( sqlite3ExprListCompare(pA->x.pList, pB->x.pList, iTab) ) return 2;
    if( pA->op!=TK_STRING
     && pA->op!=TK_TRUEFALSE
     && ALWAYS((combinedFlags & EP_Reduced)==0)
    ){
      if( pA->iColumn!=pB->iColumn ) return 2;
      if( pA->op2!=pB->op2 && pA->op==TK_TRUTH ) return 2;
      if( pA->op!=TK_IN && pA->iTable!=pB->iTable && pA->iTable!=iTab ){
        return 2;
      }
    }
  }
  return 0;
}